

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O0

bool __thiscall S1Interval::InteriorContains(S1Interval *this,double p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  ostream *poVar5;
  bool local_71;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  double local_20;
  double p_local;
  S1Interval *this_local;
  
  local_20 = p;
  p_local = (double)this;
  if (3.141592653589793 < ABS(p)) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0x4f,kFatal,(ostream *)&std::cerr);
    poVar5 = S2LogMessage::stream(&local_38);
    poVar5 = std::operator<<(poVar5,"Check failed: (fabs(p)) <= (3.14159265358979323846) ");
    S2LogMessageVoidify::operator&(&local_21,poVar5);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  if ((p == -3.141592653589793) && (!NAN(p))) {
    local_20 = 3.141592653589793;
  }
  bVar4 = is_inverted(this);
  dVar2 = local_20;
  if (!bVar4) {
    dVar1 = lo(this);
    dVar3 = local_20;
    if ((dVar1 < dVar2) && (dVar2 = hi(this), dVar3 < dVar2)) {
      return true;
    }
    bVar4 = is_full(this);
    return bVar4;
  }
  dVar1 = lo(this);
  dVar3 = local_20;
  local_71 = true;
  if (dVar2 <= dVar1) {
    dVar2 = hi(this);
    local_71 = dVar3 < dVar2;
  }
  return local_71;
}

Assistant:

bool S1Interval::InteriorContains(double p) const {
  // Works for empty, full, and singleton intervals.
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;

  if (is_inverted()) {
    return p > lo() || p < hi();
  } else {
    return (p > lo() && p < hi()) || is_full();
  }
}